

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O0

void Abc_NtkWriteLogFile(char *pFileName,Abc_Cex_t *pCex,int Status,int nFrames,char *pCommand)

{
  uint uVar1;
  FILE *__stream;
  char *local_48;
  int local_34;
  int i;
  FILE *pFile;
  char *pCommand_local;
  int nFrames_local;
  int Status_local;
  Abc_Cex_t *pCex_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open log file for writing \"%s\".\n",pFileName);
  }
  else {
    if (Status == 1) {
      fprintf(__stream,"snl_UNSAT");
    }
    else if (Status == 0) {
      fprintf(__stream,"snl_SAT");
    }
    else if (Status == -1) {
      fprintf(__stream,"snl_UNK");
    }
    else {
      printf("Abc_NtkWriteLogFile(): Cannot recognize solving status.\n");
    }
    fprintf(__stream," ");
    fprintf(__stream,"%d",(ulong)(uint)nFrames);
    fprintf(__stream," ");
    local_48 = pCommand;
    if (pCommand == (char *)0x0) {
      local_48 = "unknown";
    }
    fprintf(__stream,"%s",local_48);
    if ((pCex != (Abc_Cex_t *)0x0) && (Status == 0)) {
      fprintf(__stream," %d",(ulong)(uint)pCex->iPo);
    }
    if ((pCex != (Abc_Cex_t *)0x0) && (pCex->iFrame != nFrames)) {
      fprintf(__stream," %d",(ulong)(uint)pCex->iFrame);
    }
    fprintf(__stream,"\n");
    if (pCex == (Abc_Cex_t *)0x0) {
      fprintf(__stream,"NULL");
    }
    else {
      for (local_34 = 0; local_34 < pCex->nRegs; local_34 = local_34 + 1) {
        uVar1 = Abc_InfoHasBit((uint *)(pCex + 1),local_34);
        fprintf(__stream,"%d",(ulong)uVar1);
      }
    }
    fprintf(__stream,"\n");
    if (pCex == (Abc_Cex_t *)0x0) {
      fprintf(__stream,"NULL");
    }
    else {
      if (pCex->nBits - pCex->nRegs != pCex->nPis * (pCex->iFrame + 1)) {
        __assert_fail("pCex->nBits - pCex->nRegs == pCex->nPis * (pCex->iFrame + 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLog.c"
                      ,0x71,"void Abc_NtkWriteLogFile(char *, Abc_Cex_t *, int, int, char *)");
      }
      for (local_34 = pCex->nRegs; local_34 < pCex->nBits; local_34 = local_34 + 1) {
        uVar1 = Abc_InfoHasBit((uint *)(pCex + 1),local_34);
        fprintf(__stream,"%d",(ulong)uVar1);
      }
    }
    fprintf(__stream,"\n");
    fclose(__stream);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/*
    Log file format (Jiang, Mon, 28 Sep 2009;  updated by Alan in Jan 2011)

    <result> <bug_free_depth>  <engine_name> <0-based_output_num> <0-based_frame>
    <INIT_STATE> : default is empty line.
    <TRACE> : default is empty line
   
    <result> is one of the following: "snl_SAT", "snl_UNSAT", "snl_UNK", "snl_ABORT".
    <bug_free_depth> is the number of timeframes exhaustively explored without counter-examples
    <0-based_output_num> only need to be given if the problem is SAT.
    <0-based_frame> only need to be given if the problem is SAT and <0-based_frame> is different from <bug_free_depth>.   
    <INIT_STATE>  : initial state
    <TRACE> : input vector

    <INIT_STATE>and <TRACE> are strings of 0/1/- ( - means don't care). The length is equivalent to #input*#<cyc>.
*/


         



////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkWriteLogFile( char * pFileName, Abc_Cex_t * pCex, int Status, int nFrames, char * pCommand )
{
    FILE * pFile;
    int i;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for writing \"%s\".\n" , pFileName );
        return;
    }
    // write <result>
    if ( Status == 1 )
        fprintf( pFile, "snl_UNSAT" );
    else if ( Status == 0 )
        fprintf( pFile, "snl_SAT" );
    else if ( Status == -1 )
        fprintf( pFile, "snl_UNK" );
    else 
        printf( "Abc_NtkWriteLogFile(): Cannot recognize solving status.\n" );
    fprintf( pFile, " " );
    // write <bug_free_depth>
    fprintf( pFile, "%d", nFrames );
    fprintf( pFile, " " );
    // write <engine_name>
    fprintf( pFile, "%s", pCommand ? pCommand : "unknown" );
    if ( pCex && Status == 0 )
        fprintf( pFile, " %d", pCex->iPo );
    // write <cyc>
    if ( pCex && pCex->iFrame != nFrames )
        fprintf( pFile, " %d", pCex->iFrame );
    fprintf( pFile, "\n" );
    // write <INIT_STATE>
    if ( pCex == NULL )
        fprintf( pFile, "NULL" );
    else
    {
        for ( i = 0; i < pCex->nRegs; i++ )
            fprintf( pFile, "%d", Abc_InfoHasBit(pCex->pData,i) );
    }
    fprintf( pFile, "\n" );
    // write <TRACE>
    if ( pCex == NULL )
        fprintf( pFile, "NULL" );
    else
    {
        assert( pCex->nBits - pCex->nRegs == pCex->nPis * (pCex->iFrame + 1) );
        for ( i = pCex->nRegs; i < pCex->nBits; i++ )
            fprintf( pFile, "%d", Abc_InfoHasBit(pCex->pData,i) );
    }
    fprintf( pFile, "\n" );
    fclose( pFile );
}